

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterClass.cpp
# Opt level: O2

string * __thiscall
CharacterClass::GetName_abi_cxx11_(string *__return_storage_ptr__,CharacterClass *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_name);
  return __return_storage_ptr__;
}

Assistant:

std::string CharacterClass::GetName() {
    return m_name;
}